

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_extract.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _List *this;
  pointer *__p;
  __shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> uVar1;
  char cVar2;
  _Head_base<0UL,_mg::data::MappedMrg_*,_false> _Var3;
  _Base_ptr p_Var4;
  uint uVar5;
  char *in_RCX;
  size_type i;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  undefined1 local_1e8 [8];
  string output_basename;
  undefined1 local_1a0 [8];
  set<long,_std::less<long>,_std::allocator<long>_> extract_indices;
  string hed_filename;
  string mrg_filename;
  string nam_filename;
  string hed_raw;
  string nam_raw;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [8];
  anon_class_40_5_4793491c write_entry;
  shared_ptr<mg::fs::MappedFile> mrg_data;
  Nam nam;
  path output_dir;
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> mrg;
  char *input_basename;
  bool has_nam;
  
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&extract_indices;
  extract_indices._M_t._M_impl._0_4_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  mrg._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
  _M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
  super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl =
       (__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>)
       (__uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>)0x0;
  iVar7 = 1;
  _Var3._M_head_impl = (MappedMrg *)0x0;
  bVar8 = false;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (argc <= iVar7) {
      if ((__uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>)
          mrg._M_t.
          super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>._M_t
          .super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
          super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>)0x0) {
LAB_00106733:
        usage(*argv);
LAB_0010673b:
        iVar7 = -1;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"%s.hed",
                   (allocator<char> *)local_c0);
        mg::string::format<char_const*>
                  ((string *)&extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (string *)
                   mrg._M_t.
                   super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                   .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl,in_RCX);
        std::__cxx11::string::~string
                  ((string *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"%s.mrg",
                   (allocator<char> *)local_c0);
        mg::string::format<char_const*>
                  ((string *)((long)&hed_filename.field_2 + 8),
                   (string *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (string *)
                   mrg._M_t.
                   super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                   .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl,in_RCX);
        std::__cxx11::string::~string
                  ((string *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        nam_filename.field_2._8_8_ = &hed_raw._M_string_length;
        hed_raw._M_dataplus._M_p = (pointer)0x0;
        hed_raw._M_string_length._0_1_ = 0;
        bVar9 = mg::fs::read_file((char *)extract_indices._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(string *)((long)&nam_filename.field_2 + 8))
        ;
        if (bVar9) {
          mg::fs::MappedFile::open
                    ((char *)&nam.names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     hed_filename.field_2._8_4_);
          std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
                    ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)
                     &write_entry.output_dir,
                     (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                     &nam.names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
                    ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                     &nam.names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (write_entry.output_dir == (path *)0x0) {
            iVar7 = -1;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)
                       &nam.names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"%s.nam",
                       (allocator<char> *)local_c0);
            mg::string::format<char_const*>
                      ((string *)((long)&mrg_filename.field_2 + 8),
                       (string *)
                       &nam.names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)
                       mrg._M_t.
                       super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                       .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl,in_RCX);
            std::__cxx11::string::~string
                      ((string *)
                       &nam.names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            hed_raw.field_2._8_8_ = &nam_raw._M_string_length;
            nam_raw._M_dataplus._M_p = (pointer)0x0;
            nam_raw._M_string_length._0_1_ = 0;
            mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            nam.names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            nam.names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            bVar9 = mg::fs::read_file((char *)mrg_filename.field_2._8_8_,
                                      (string *)((long)&hed_raw.field_2 + 8));
            if (bVar9) {
              bVar9 = mg::data::nam_read((string *)((long)&hed_raw.field_2 + 8),
                                         (Nam *)&mrg_data.
                                                 super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
            }
            else {
              bVar9 = false;
            }
            this_00 = (__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&nam_raw.field_2 + 8);
            input_basename._7_1_ = bVar9;
            std::__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (this_00,(__shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2> *)
                               &write_entry.output_dir);
            this = &output_dir._M_cmpts;
            mg::data::MappedMrg::parse
                      ((MappedMrg *)this,(string *)((long)&nam_filename.field_2 + 8),
                       (shared_ptr<mg::fs::MappedFile> *)this_00);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
            iVar7 = -1;
            if (output_dir._32_8_ != 0) {
              if ((bVar9 == false) ||
                 (*(long *)(output_dir._32_8_ + 0x18) - *(long *)(output_dir._32_8_ + 0x10) >> 3 ==
                  (long)nam.names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi >> 5)) {
                local_c0 = (undefined1  [8])".";
                if (_Var3._M_head_impl != (MappedMrg *)0x0) {
                  local_c0 = (undefined1  [8])_Var3._M_head_impl;
                }
                std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                          ((path *)&nam.names.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char **)local_c0,auto_format);
                __p = &nam.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bVar9 = std::filesystem::exists((path *)__p);
                if ((bVar9) ||
                   (cVar2 = std::filesystem::create_directories
                                      ((path *)&nam.names.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage),
                   cVar2 != '\0')) {
                  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                            ((path *)((long)&output_basename.field_2 + 8),(char **)&mrg,auto_format)
                  ;
                  std::filesystem::__cxx11::path::stem
                            ((path *)local_c0,(path *)((long)&output_basename.field_2 + 8));
                  std::__cxx11::string::string((string *)local_1e8,(string *)local_c0);
                  std::filesystem::__cxx11::path::~path((path *)local_c0);
                  std::filesystem::__cxx11::path::~path
                            ((path *)((long)&output_basename.field_2 + 8));
                  write_entry.output_basename = (string *)((long)&input_basename + 7);
                  write_entry.has_nam =
                       (bool *)&mrg_data.
                                super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount;
                  local_c0 = (undefined1  [8])local_1e8;
                  write_entry.nam = (Nam *)this;
                  write_entry.mrg =
                       (unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *
                       )__p;
                  if (bVar8) {
                    for (p_Var4 = extract_indices._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_parent; p_Var4 != (_Rb_tree_node_base *)&extract_indices;
                        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
                      main::anon_class_40_5_4793491c::operator()
                                ((anon_class_40_5_4793491c *)local_c0,p_Var4[1]._M_color);
                    }
                  }
                  else {
                    for (uVar6 = 0;
                        uVar6 < (ulong)(*(long *)(output_dir._32_8_ + 0x18) -
                                        *(long *)(output_dir._32_8_ + 0x10) >> 3); uVar6 = uVar6 + 1
                        ) {
                      main::anon_class_40_5_4793491c::operator()
                                ((anon_class_40_5_4793491c *)local_c0,(uint)uVar6);
                    }
                  }
                  std::__cxx11::string::~string((string *)local_1e8);
                  iVar7 = 0;
                }
                else {
                  fprintf(_stderr,"Failed to create output path \'%s\'\n",
                          nam.names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar7 = -1;
                }
                std::filesystem::__cxx11::path::~path
                          ((path *)&nam.names.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                fprintf(_stderr,"MRG entry count (%lu) does not match NAM entry count (%lu)\n");
              }
            }
            std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
            ~unique_ptr((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                         *)&output_dir._M_cmpts);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mrg_data.
                          super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            std::__cxx11::string::~string((string *)(hed_raw.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(mrg_filename.field_2._M_local_buf + 8));
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mrg_data);
        }
        else {
          iVar7 = -1;
        }
        std::__cxx11::string::~string((string *)(nam_filename.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(hed_filename.field_2._M_local_buf + 8));
        std::__cxx11::string::~string
                  ((string *)&extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                 *)local_1a0);
      return iVar7;
    }
    uVar1._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
    ._M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
    super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl =
         *(__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>
           *)&((_Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_> *
               )(argv + iVar7))->super__Head_base<0UL,_mg::data::MappedMrg_*,_false>;
    uVar5 = (byte)*(string *)
                   uVar1._M_t.
                   super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                   .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl - 0x2d;
    if ((uVar5 == 0) &&
       (uVar5 = (byte)*(string *)
                       ((long)uVar1._M_t.
                              super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                              .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl + 1)
                - 0x69, uVar5 == 0)) {
      uVar5 = (uint)(byte)*(string *)
                           ((long)uVar1._M_t.
                                  super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                                  .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl
                           + 2);
    }
    in_RCX = (char *)(ulong)-uVar5;
    if (-uVar5 == 0) {
      iVar7 = iVar7 + 1;
      if (argc <= iVar7) {
        fwrite("Missing argument for -i\n",0x18,1,_stderr);
        goto LAB_0010673b;
      }
      local_c0 = (undefined1  [8])
                 strtol(argv[iVar7],
                        (char **)&nam.names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      if (nam.names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)argv[iVar7]) {
        fprintf(_stderr,"Failed to parse index \'%s\'\n");
        goto LAB_0010673b;
      }
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_emplace_unique<long&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 local_1a0,(long *)local_c0);
      bVar8 = true;
      uVar1 = mrg;
    }
    else if (((__uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>)
              mrg._M_t.
              super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
              _M_t.
              super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
              .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>)0x0)
            && (bVar9 = (_Head_base<0UL,_mg::data::MappedMrg_*,_false>)_Var3._M_head_impl !=
                        (_Head_base<0UL,_mg::data::MappedMrg_*,_false>)0x0,
               _Var3._M_head_impl =
                    (MappedMrg *)
                    uVar1._M_t.
                    super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                    .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl,
               uVar1._M_t.
               super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
               ._M_t.
               super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
               .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl =
                    mrg._M_t.
                    super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                    .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl, bVar9))
    goto LAB_00106733;
    mrg._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
    _M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
    super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl =
         uVar1._M_t.
         super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>._M_t.
         super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
         super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool targeted_extract = false;
  std::set<long> extract_indices;

  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    if (!strcmp("-i", argv[i])) {
      // Check it is followed by an index
      if (i + 1 >= argc) {
        fprintf(stderr, "Missing argument for -i\n");
        return -1;
      }

      // Entry specifier
      targeted_extract = true;
      char *endptr;
      long extract_idx = strtol(argv[i + 1], &endptr, 0);
      if (endptr == argv[i + 1]) {
        fprintf(stderr, "Failed to parse index '%s'\n", argv[i + 1]);
        return -1;
      }

      // Add to extract set
      extract_indices.emplace(extract_idx);

      // Skip arg and loop
      i++;
      continue;
    }

    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed file
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  const std::string output_basename =
      std::filesystem::path(input_basename).stem();
  auto write_entry = [&](unsigned index) -> int {
    std::string output_filename =
        mg::string::format("%s.%08lu.dat", output_basename.c_str(), index);

    // If we have a name table, use that name as well
    if (has_nam) {
      output_filename =
          mg::string::format("%s.%08lu.%s.dat", output_basename.c_str(), index,
                             nam.names[index].c_str());
    }

    auto entry_data = mrg->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(output_filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  if (!targeted_extract) {
    for (std::vector<std::string>::size_type i = 0; i < mrg->entries().size();
         i++) {
      write_entry(i);
    }
  } else {
    for (long i : extract_indices) {
      write_entry(i);
    }
  }

  return 0;
}